

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_fortify(bool verbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  GameLoop *pGVar4;
  reference ppPVar5;
  reference ppCVar6;
  Country *pCVar7;
  ostream *poVar8;
  Country *neighbour;
  string local_70;
  string local_50;
  
  GameLoop::start();
  pGVar4 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar4);
  pGVar4 = GameLoop::getInstance();
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar4->allPlayers,0);
  ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                      ((*ppPVar5)->pOwnedCountries,0);
  iVar1 = *(*ppCVar6)->pNumberOfTroops;
  pCVar7 = (Country *)operator_new(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"neighbour",(allocator<char> *)&local_70);
  Map::Country::Country(pCVar7,99,&local_50,1);
  std::__cxx11::string::~string((string *)&local_50);
  neighbour = pCVar7;
  pGVar4 = GameLoop::getInstance();
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar4->allPlayers,0);
  *pCVar7->pPlayerOwnerId = *(*ppPVar5)->pPlayerId;
  iVar2 = *pCVar7->pNumberOfTroops;
  pGVar4 = GameLoop::getInstance();
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar4->allPlayers,0);
  ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                      ((*ppPVar5)->pOwnedCountries,0);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            ((*ppCVar6)->pAdjCountries,&neighbour);
  pGVar4 = GameLoop::getInstance();
  ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar4->allPlayers,0);
  iVar3 = Player::fortify(*ppPVar5);
  if (verbose) {
    pGVar4 = GameLoop::getInstance();
    ppPVar5 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar4->allPlayers,0);
    ppCVar6 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::at
                        ((*ppPVar5)->pOwnedCountries,0);
    pCVar7 = *ppCVar6;
    std::operator<<((ostream *)&std::cout,"\x1b[35m");
    poVar8 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_70,pCVar7);
    poVar8 = std::operator<<(poVar8,(string *)&local_70);
    poVar8 = std::operator<<(poVar8," had ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar1);
    poVar8 = std::operator<<(poVar8," armies");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_70);
    poVar8 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_70,pCVar7);
    poVar8 = std::operator<<(poVar8,(string *)&local_70);
    poVar8 = std::operator<<(poVar8," now has ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pCVar7->pNumberOfTroops);
    poVar8 = std::operator<<(poVar8," armies");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_70);
    poVar8 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_70,neighbour);
    poVar8 = std::operator<<(poVar8,(string *)&local_70);
    poVar8 = std::operator<<(poVar8," had ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar2);
    poVar8 = std::operator<<(poVar8," armies");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_70);
    poVar8 = std::operator<<((ostream *)&std::cout,"Country ");
    Map::Country::getCountryName_abi_cxx11_(&local_70,neighbour);
    poVar8 = std::operator<<(poVar8,(string *)&local_70);
    poVar8 = std::operator<<(poVar8," now has ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*neighbour->pNumberOfTroops);
    poVar8 = std::operator<<(poVar8," armies");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator<<((ostream *)&std::cout,"\x1b[31m");
  }
  GameLoop::resetInstance();
  return iVar3 != -1;
}

Assistant:

bool test_Player_fortify(bool verbose = false) {

    bool success = true;
    GameLoop::start();
    GameLoop::getInstance()->distributeArmies(); // because you need armies to fortify

    int numArmiesC1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getNumberOfTroops();
    auto* neighbour = new Map::Country(99, "neighbour", 1);
    neighbour->setPlayerOwnerID(GameLoop::getInstance()->getAllPlayers()->at(0)->getPlayerId());
    int numArmiesC2 = neighbour->getNumberOfTroops();

    GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0)->getAdjCountries()->push_back(neighbour);

    if (GameLoop::getInstance()->getAllPlayers()->at(0)->fortify() == PlayerAction::FAILED) {
        success = false;
    }

    if (verbose) {
        Map::Country* c1 = GameLoop::getInstance()->getAllPlayers()->at(0)->getOwnedCountries()->at(0);
        std::cout << "\033[35m";
        std::cout << "Country " << c1->getCountryName() << " had " << numArmiesC1 << " armies" << std::endl;
        std::cout << "Country " << c1->getCountryName() << " now has " << c1->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " had " << numArmiesC2 <<" armies" << std::endl;
        std::cout << "Country " << neighbour->getCountryName() << " now has " << neighbour->getNumberOfTroops() << " armies"
                  << std::endl;
        std::cout << "\033[31m";
    }
    GameLoop::resetInstance();
    return success;
}